

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::swap
          (Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this,Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *other)

{
  int iVar1;
  InnerMap *pIVar2;
  Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> copy;
  Map<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  MStack_28;
  
  if (this->arena_ == other->arena_) {
    iVar1 = this->default_enum_value_;
    this->default_enum_value_ = other->default_enum_value_;
    other->default_enum_value_ = iVar1;
    pIVar2 = this->elements_;
    this->elements_ = other->elements_;
    other->elements_ = pIVar2;
  }
  else {
    Map(&MStack_28,this);
    operator=(this,other);
    operator=(other,&MStack_28);
    ~Map(&MStack_28);
  }
  return;
}

Assistant:

void swap(Map& other) {
    if (arena_ == other.arena_) {
      std::swap(default_enum_value_, other.default_enum_value_);
      std::swap(elements_, other.elements_);
    } else {
      // TODO(zuguang): optimize this. The temporary copy can be allocated
      // in the same arena as the other message, and the "other = copy" can
      // be replaced with the fast-path swap above.
      Map copy = *this;
      *this = other;
      other = copy;
    }
  }